

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

bool MakeAMove(Situation *situation,Movement *move,bool isbegin)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  byte in_DL;
  byte *in_RSI;
  int *in_RDI;
  bool bVar9;
  Movement *in_stack_00000010;
  int i_1;
  int catc;
  int movec;
  int i;
  int last_index;
  int check;
  int longcatopp;
  int longcatme;
  int col_1;
  int row_1;
  int col;
  int row;
  int piece_id_to;
  int piece_id_from;
  undefined8 in_stack_ffffffffffffffa0;
  int *piVar10;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  int local_48;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = *(byte *)((long)in_RDI + (ulong)*in_RSI + 4);
  uVar2 = (uint)bVar1;
  uVar3 = (uint)*(byte *)((long)in_RDI + (ulong)in_RSI[1] + 4);
  ZobristKey = ZobristTable[(int)uVar2][*in_RSI] ^ ZobristPlayer ^ ZobristKey;
  if (uVar3 != 0) {
    ZobristKey = ZobristTable[(int)uVar3][in_RSI[1]] ^ ZobristKey;
  }
  ZobristKey = ZobristTable[(int)uVar2][in_RSI[1]] ^ ZobristKey;
  ZobristKeyCheck = ZobristTableCheck[(int)uVar2][*in_RSI] ^ ZobristPlayerCheck ^ ZobristKeyCheck;
  if (uVar3 != 0) {
    ZobristKeyCheck = ZobristTableCheck[(int)uVar3][in_RSI[1]] ^ ZobristKeyCheck;
  }
  ZobristKeyCheck =
       ZobristTableCheck[*(byte *)((long)in_RDI + (ulong)*in_RSI + 4)][in_RSI[1]] ^ ZobristKeyCheck;
  in_RDI[(long)*in_RDI + 0x5d] =
       in_RDI[(long)*in_RDI + 0x5d] - PiecesValue[*in_RDI][PIECE_NUM_TO_TYPE[(int)uVar2]][*in_RSI];
  in_RDI[(long)*in_RDI + 0x5d] =
       PiecesValue[*in_RDI][PIECE_NUM_TO_TYPE[(int)uVar2]][in_RSI[1]] + in_RDI[(long)*in_RDI + 0x5d]
  ;
  if (uVar3 == 0) {
    iVar4 = GetRow((uint)*in_RSI);
    iVar5 = GetCol((uint)*in_RSI);
    *(ushort *)((long)in_RDI + (long)iVar4 * 2 + 0x134) =
         *(ushort *)((long)in_RDI + (long)iVar4 * 2 + 0x134) ^ BIT_ROW_MASK[*in_RSI];
    *(ushort *)((long)in_RDI + (long)iVar5 * 2 + 0x154) =
         *(ushort *)((long)in_RDI + (long)iVar5 * 2 + 0x154) ^ BIT_COL_MASK[*in_RSI];
    iVar4 = GetRow((uint)in_RSI[1]);
    in_stack_ffffffffffffffcc = GetCol((uint)in_RSI[1]);
    *(ushort *)((long)in_RDI + (long)iVar4 * 2 + 0x134) =
         *(ushort *)((long)in_RDI + (long)iVar4 * 2 + 0x134) ^ BIT_ROW_MASK[in_RSI[1]];
    *(ushort *)((long)in_RDI + (long)in_stack_ffffffffffffffcc * 2 + 0x154) =
         *(ushort *)((long)in_RDI + (long)in_stack_ffffffffffffffcc * 2 + 0x154) ^
         BIT_COL_MASK[in_RSI[1]];
    *(undefined1 *)((long)in_RDI + (ulong)*in_RSI + 4) = 0;
    *(byte *)((long)in_RDI + (ulong)in_RSI[1] + 4) = bVar1;
    *(byte *)((long)in_RDI + (long)(int)uVar2 + 0x104) = in_RSI[1];
  }
  else {
    iVar4 = ColorOfPiece((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    iVar4 = PiecesValue[iVar4][PIECE_NUM_TO_TYPE[(int)uVar3]][in_RSI[1]];
    piVar10 = in_RDI;
    iVar5 = ColorOfPiece((int)((ulong)in_RDI >> 0x20));
    piVar10[(long)iVar5 + 0x5d] = piVar10[(long)iVar5 + 0x5d] - iVar4;
    in_stack_ffffffffffffffd8 = GetRow((uint)*in_RSI);
    iVar4 = GetCol((uint)*in_RSI);
    *(ushort *)((long)in_RDI + (long)in_stack_ffffffffffffffd8 * 2 + 0x134) =
         *(ushort *)((long)in_RDI + (long)in_stack_ffffffffffffffd8 * 2 + 0x134) ^
         BIT_ROW_MASK[*in_RSI];
    *(ushort *)((long)in_RDI + (long)iVar4 * 2 + 0x154) =
         *(ushort *)((long)in_RDI + (long)iVar4 * 2 + 0x154) ^ BIT_COL_MASK[*in_RSI];
    *(undefined1 *)((long)in_RDI + (ulong)*in_RSI + 4) = 0;
    *(byte *)((long)in_RDI + (ulong)in_RSI[1] + 4) = bVar1;
    *(byte *)((long)in_RDI + (long)(int)uVar2 + 0x104) = in_RSI[1];
    *(undefined1 *)((long)in_RDI + (long)(int)uVar3 + 0x104) = 0;
  }
  iVar4 = 1;
  bVar9 = true;
  if ((in_DL & 1) != 0) {
    iVar5 = Catch(_catc,in_stack_00000010);
    in_RSI[8] = (byte)iVar5;
    in_RSI[9] = bVar1;
    if (in_RSI[8] == 0) {
      iVar5 = CheckOpponent((Situation *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
      if (iVar5 == 0) {
        iVar4 = 0;
      }
      else {
        iVar6 = OpponentPlayer(*in_RDI);
        iVar6 = GetPlayerFlag(iVar6);
        in_RSI[8] = (byte)iVar6;
        in_RSI[9] = (byte)iVar5;
      }
    }
    sVar7 = std::vector<Movement,_std::allocator<Movement>_>::size
                      ((vector<Movement,_std::allocator<Movement>_> *)(in_RDI + 0x7e));
    if ((5 < sVar7) && (in_RSI[8] != 0)) {
      sVar7 = std::vector<Movement,_std::allocator<Movement>_>::size
                        ((vector<Movement,_std::allocator<Movement>_> *)(in_RDI + 0x7e));
      iVar5 = (int)sVar7 + -1;
      for (local_48 = 1; local_48 < 6; local_48 = local_48 + 2) {
        pvVar8 = std::vector<Movement,_std::allocator<Movement>_>::operator[]
                           ((vector<Movement,_std::allocator<Movement>_> *)(in_RDI + 0x7e),
                            (long)(iVar5 - local_48));
        if ((pvVar8->catc != in_RSI[8]) ||
           (pvVar8 = std::vector<Movement,_std::allocator<Movement>_>::operator[]
                               ((vector<Movement,_std::allocator<Movement>_> *)(in_RDI + 0x7e),
                                (long)(iVar5 - local_48)), pvVar8->movec != in_RSI[9])) {
          iVar4 = 0;
          break;
        }
      }
      pvVar8 = std::vector<Movement,_std::allocator<Movement>_>::operator[]
                         ((vector<Movement,_std::allocator<Movement>_> *)(in_RDI + 0x7e),(long)iVar5
                         );
      in_stack_ffffffffffffffb4 = (uint)pvVar8->movec;
      pvVar8 = std::vector<Movement,_std::allocator<Movement>_>::operator[]
                         ((vector<Movement,_std::allocator<Movement>_> *)(in_RDI + 0x7e),(long)iVar5
                         );
      in_stack_ffffffffffffffb0 = (uint)pvVar8->catc;
      bVar9 = in_stack_ffffffffffffffb0 != 0;
      if ((iVar4 != 0) && (in_stack_ffffffffffffffb4 != 0)) {
        for (in_stack_ffffffffffffffac = 2; in_stack_ffffffffffffffac < 5;
            in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 2) {
          pvVar8 = std::vector<Movement,_std::allocator<Movement>_>::operator[]
                             ((vector<Movement,_std::allocator<Movement>_> *)(in_RDI + 0x7e),
                              (long)(iVar5 - in_stack_ffffffffffffffac));
          if ((pvVar8->catc != in_stack_ffffffffffffffb0) ||
             (pvVar8 = std::vector<Movement,_std::allocator<Movement>_>::operator[]
                                 ((vector<Movement,_std::allocator<Movement>_> *)(in_RDI + 0x7e),
                                  (long)(iVar5 - in_stack_ffffffffffffffac)),
             pvVar8->movec != in_stack_ffffffffffffffb4)) {
            bVar9 = false;
            break;
          }
        }
      }
    }
  }
  std::vector<Movement,_std::allocator<Movement>_>::push_back
            ((vector<Movement,_std::allocator<Movement>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  step = step + 1;
  if ((((in_DL & 1) == 0) || (iVar4 == 0)) || (bVar9)) {
    bVar9 = BeChecked((Situation *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
    if (bVar9) {
      ChangePlayer(in_RDI);
      local_1 = true;
    }
    else {
      ChangePlayer(in_RDI);
      local_1 = KingFacing((Situation *)CONCAT44(in_stack_ffffffffffffffcc,iVar4));
    }
  }
  else {
    ChangePlayer(in_RDI);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MakeAMove(Situation & situation,Movement & move, bool isbegin){

    int piece_id_from = situation.current_board[move.from];
    int piece_id_to = situation.current_board[move.to];

    

    // 1. 置换表更新
    // 1.1 当前局面哈希值
    ZobristKey ^= ZobristPlayer;
    ZobristKey ^= ZobristTable[piece_id_from][move.from];
    if(piece_id_to != 0)
        ZobristKey ^= ZobristTable[piece_id_to][move.to];
    ZobristKey ^= ZobristTable[piece_id_from][move.to];

    //  1.2 当前局面哈希校验值
    ZobristKeyCheck ^= ZobristPlayerCheck;
    ZobristKeyCheck ^= ZobristTableCheck[piece_id_from][move.from];
    if(piece_id_to != 0)
        ZobristKeyCheck ^= ZobristTableCheck[piece_id_to][move.to];
    ZobristKeyCheck ^= ZobristTableCheck[situation.current_board[move.from]][move.to];

    // 2. 更新子力价值
    situation.value[situation.current_player] -= PiecesValue[situation.current_player][PIECE_NUM_TO_TYPE[piece_id_from]][move.from];
    situation.value[situation.current_player] += PiecesValue[situation.current_player][PIECE_NUM_TO_TYPE[piece_id_from]][move.to];

    // 3. 移动棋子
    // 4.1 如果是吃子着法
    if(piece_id_to != 0){
        // 4.1.1 更新子力价值
        situation.value[ColorOfPiece(piece_id_to)] -= PiecesValue[ColorOfPiece(piece_id_to)][PIECE_NUM_TO_TYPE[piece_id_to]][move.to];
        // 4.1.2 只更新起始格的位行位列
        int row = GetRow(move.from), col = GetCol(move.from);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.from];
        situation.bit_col[col] ^= BIT_COL_MASK[move.from];
        // 4.1.3 更新棋子棋盘数组
        situation.current_board[move.from] = 0;
        situation.current_board[move.to] = piece_id_from;
        situation.current_pieces[piece_id_from] = move.to;
        situation.current_pieces[piece_id_to] = 0;
    }else{
        // 4.1.1 更新起始格的位行位列
        int row = GetRow(move.from), col = GetCol(move.from);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.from];
        situation.bit_col[col] ^= BIT_COL_MASK[move.from];
        // 4.1.2 更新目标格的位行位列
        row = GetRow(move.to), col = GetCol(move.to);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.to];
        situation.bit_col[col] ^= BIT_COL_MASK[move.to];
        // 4.1.3 更新棋子棋盘数组
        situation.current_board[move.from] = 0;
        situation.current_board[move.to] = piece_id_from;
        situation.current_pieces[piece_id_from] = move.to;
    
    }

    // 4. 如果是开始转换局面或者试探局面，则需要判断该着法是否抓子，抓的是哪个子
    int longcatme = 1, longcatopp = 1;
    if(isbegin){
        move.catc = Catch(situation, move);
        move.movec = piece_id_from;
        if(move.catc == 0){
            int check = CheckOpponent(situation);
            if(check){
                move.catc = GetPlayerFlag(OpponentPlayer(situation.current_player)) + 0;
                move.movec = check;
            }else longcatme = 0;
        }
        // 判断自己是否已经走了6步同一子a捉同一子b
        if(situation.moves_stack.size() >= 6 && move.catc){
            int last_index = situation.moves_stack.size() - 1;
            for(int i = 1; i <= 5; i += 2){
                if(!(situation.moves_stack[last_index - i].catc == move.catc && situation.moves_stack[last_index - i].movec == move.movec)){
                    longcatme = 0;
                    break;
                }
            }
            // 如果自己长抓，判断对方是否也长抓
            int movec = situation.moves_stack[last_index].movec;
            int catc = situation.moves_stack[last_index].catc;
            if(catc == 0) longcatopp = 0;
            if(longcatme && movec){
                for(int i = 2; i <= 4; i += 2){
                    if(!(situation.moves_stack[last_index - i].catc == catc && situation.moves_stack[last_index - i].movec == movec)){
                        longcatopp = 0;
                        break;
                    }
                }
            }
        }
    }

    // 5. 放入走法栈
    situation.moves_stack.push_back(move);
    step++;

    // 自己长抓，对方没长抓，则返回true
    if(isbegin && longcatme && !longcatopp){
        ChangePlayer(situation.current_player);
        return true;
    }

    // 6. 交换走棋方
    if(BeChecked(situation)){
        ChangePlayer(situation.current_player);
        return true;
    }
    ChangePlayer(situation.current_player);
    return KingFacing(situation);
}